

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O2

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::drawIndexSample
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          vector<int,_std::allocator<int>_> *sample)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  pointer __src;
  long lVar7;
  ulong uVar8;
  size_t __n;
  
  piVar1 = (sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __src = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  lVar7 = (long)(this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__src;
  __n = (long)piVar2 - (long)piVar1;
  for (uVar5 = 0; uVar8 = (ulong)uVar5, uVar8 < (ulong)((long)__n >> 2); uVar5 = uVar5 + 1) {
    piVar3 = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = rnd(this);
    uVar6 = (ulong)(long)iVar4 % ((lVar7 >> 2) - uVar8);
    __src = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
    iVar4 = piVar3[uVar8];
    piVar3[uVar8] = __src[uVar6 + uVar8];
    __src[uVar6 + uVar8] = iVar4;
  }
  if (piVar2 != piVar1) {
    memmove((sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start,__src,__n);
    return;
  }
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::drawIndexSample(
    std::vector<int> & sample)
{
  size_t sample_size = sample.size();
  size_t index_size = shuffled_indices_.size();
  for( unsigned int i = 0; i < sample_size; ++i )
  {
    // The 1/(RAND_MAX+1.0) trick is when the random numbers are not uniformly
    // distributed and for small modulo elements, that does not matter
    // (and nowadays, random number generators are good)
    //std::swap (shuffled_indices_[i], shuffled_indices_[i + (rand () % (index_size - i))]);
    std::swap(
        shuffled_indices_[i],
        shuffled_indices_[i + (rnd() % (index_size - i))] );
  }
  std::copy(
      shuffled_indices_.begin(),
      shuffled_indices_.begin() + sample_size,
      sample.begin() );
}